

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O1

tidyLocaleMapItemImpl * prvTidygetNextWindowsLanguage(TidyIterator *iter)

{
  ulong uVar1;
  _html5Info *p_Var2;
  TidyIterator p_Var3;
  TidyIterator p_Var4;
  
  if (iter != (TidyIterator *)0x0) {
    p_Var3 = *iter;
    if (p_Var3 == (TidyIterator)0x0) {
      p_Var2 = (_html5Info *)0x0;
      p_Var3 = (TidyIterator)0x0;
    }
    else {
      if (tidyLanguageListSize_array_size == 0) {
        uVar1 = 0;
        do {
          tidyLanguageListSize_array_size = (int)uVar1 + 1;
          uVar1 = (ulong)tidyLanguageListSize_array_size;
        } while (localeMappings[uVar1].winName != (ctmbstr)0x0);
      }
      if ((TidyIterator)(ulong)tidyLanguageListSize_array_size < p_Var3) {
        p_Var2 = (_html5Info *)0x0;
      }
      else {
        p_Var2 = html5Info + (long)(p_Var3 + 3);
        p_Var3 = (TidyIterator)((long)&p_Var3->_opaque + 1);
      }
    }
    if (tidyLanguageListSize_array_size == 0) {
      uVar1 = 0;
      do {
        tidyLanguageListSize_array_size = (int)uVar1 + 1;
        uVar1 = (ulong)tidyLanguageListSize_array_size;
      } while (localeMappings[uVar1].winName != (ctmbstr)0x0);
    }
    p_Var4 = (TidyIterator)0x0;
    if (p_Var3 <= (TidyIterator)(ulong)tidyLanguageListSize_array_size) {
      p_Var4 = p_Var3;
    }
    *iter = p_Var4;
    return (tidyLocaleMapItemImpl *)p_Var2;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]libtidy/src/language.c"
                ,0x241,"const tidyLocaleMapItemImpl *prvTidygetNextWindowsLanguage(TidyIterator *)")
  ;
}

Assistant:

const tidyLocaleMapItemImpl *TY_(getNextWindowsLanguage)( TidyIterator *iter )
{
    const tidyLocaleMapItemImpl *item = NULL;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= tidyLanguageListSize() )
    {
        item = &localeMappings[ itemIndex -1 ];
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= tidyLanguageListSize() ? itemIndex : (size_t)0 );
    return item;
}